

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosYAML.cpp
# Opt level: O0

void adios2::helper::ParseHostOptionsFile
               (Comm *comm,string *configFileYAML,HostOptions *hosts,string *homePath)

{
  bool bVar1;
  iterator_value *piVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>_>,_bool>
  pVar3;
  string authStr_1;
  string authStr;
  string protocolStr;
  Node *hostmap;
  HostConfig hc;
  iterator itHost;
  vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_> hostConfigs;
  Node hostentry;
  string hostname;
  const_iterator itDoc;
  Node document;
  string configFileContents;
  string hint;
  Node *in_stack_fffffffffffff008;
  undefined7 in_stack_fffffffffffff010;
  undefined1 in_stack_fffffffffffff017;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>_>
  in_stack_fffffffffffff018;
  allocator *in_stack_fffffffffffff020;
  string *in_stack_fffffffffffff028;
  Node *in_stack_fffffffffffff038;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff050;
  string *in_stack_fffffffffffff058;
  string *in_stack_fffffffffffff060;
  string *in_stack_fffffffffffff068;
  string *in_stack_fffffffffffff070;
  HostConfig *in_stack_fffffffffffff080;
  Node *in_stack_fffffffffffff088;
  Node *in_stack_fffffffffffff090;
  string *in_stack_fffffffffffff098;
  allocator *in_stack_fffffffffffff0a0;
  undefined1 mandatory;
  string *in_stack_fffffffffffff0a8;
  Node *in_stack_fffffffffffff0b0;
  undefined4 in_stack_fffffffffffff0b8;
  HostAuthProtocol in_stack_fffffffffffff0bc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff0c0;
  iterator_base<const_YAML::detail::iterator_value> *in_stack_fffffffffffff0e8;
  string *in_stack_fffffffffffff1b8;
  string local_dd0 [32];
  string local_db0 [32];
  string local_d90 [32];
  string local_d70 [32];
  string local_d50 [39];
  allocator local_d29;
  string local_d28 [39];
  undefined1 local_d01 [40];
  allocator local_cd9;
  string local_cd8 [39];
  allocator local_cb1;
  string local_cb0 [39];
  undefined1 local_c89 [40];
  undefined1 local_c61 [40];
  undefined1 local_c39 [40];
  undefined1 local_c11 [40];
  undefined1 local_be9 [40];
  allocator local_bc1;
  string local_bc0 [39];
  undefined1 local_b99 [33];
  string local_b78 [39];
  undefined1 local_b51 [33];
  string local_b30 [39];
  allocator local_b09;
  string local_b08 [39];
  allocator local_ae1;
  string local_ae0 [39];
  allocator local_ab9;
  string local_ab8 [39];
  allocator local_a91;
  string local_a90 [39];
  allocator local_a69;
  string local_a68 [32];
  string local_a48 [39];
  allocator local_a21;
  string local_a20 [32];
  string local_a00 [32];
  string local_9e0 [39];
  allocator local_9b9;
  string local_9b8 [32];
  string local_998 [39];
  allocator local_971;
  string local_970 [32];
  string local_950 [32];
  string local_930 [32];
  string local_910 [39];
  allocator local_8e9;
  string local_8e8 [39];
  allocator local_8c1;
  string local_8c0 [39];
  allocator local_899;
  string local_898 [32];
  proxy local_878;
  Node *local_7b8;
  proxy local_7b0;
  string local_6f0 [32];
  string local_6d0 [32];
  HostAccessProtocol local_6b0;
  string local_6a8;
  string local_688;
  undefined1 local_668 [72];
  string local_620;
  Node local_5ff;
  string local_580 [32];
  string local_560 [32];
  string local_540 [39];
  allocator local_519;
  string local_518 [39];
  allocator local_4f1;
  string local_4f0 [39];
  allocator local_4c9;
  string local_4c8 [32];
  proxy local_4a8;
  proxy local_3a8;
  string local_2e8 [36];
  undefined4 local_2c4;
  string local_260 [39];
  allocator local_239;
  string local_238 [39];
  allocator local_211;
  string local_210 [39];
  allocator local_1e9;
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [39];
  allocator local_161;
  string local_160 [39];
  allocator local_139;
  string local_138 [39];
  allocator local_111;
  string local_110 [96];
  string local_b0 [32];
  string local_90 [48];
  string local_60 [32];
  string local_40 [64];
  
  std::operator+((char *)in_stack_fffffffffffff058,in_stack_fffffffffffff050);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff018._M_node,
                 (char *)CONCAT17(in_stack_fffffffffffff017,in_stack_fffffffffffff010));
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::string(local_b0,local_40);
  Comm::BroadcastFile((Comm *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8),
                      (string *)in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8,
                      (int)((ulong)in_stack_fffffffffffff0a0 >> 0x20));
  std::__cxx11::string::~string(local_b0);
  YAML::Load(in_stack_fffffffffffff1b8);
  bVar1 = YAML::Node::operator!((Node *)0x9da228);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,"Helper",&local_111);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_138,"adiosHostOptions",&local_139);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_160,"ParseHostOptionsFile",&local_161);
    std::operator+((char *)in_stack_fffffffffffff058,in_stack_fffffffffffff050);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff018._M_node,
                   (char *)CONCAT17(in_stack_fffffffffffff017,in_stack_fffffffffffff010));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff018._M_node,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff017,in_stack_fffffffffffff010));
    Throw<std::invalid_argument>
              (in_stack_fffffffffffff070,in_stack_fffffffffffff068,in_stack_fffffffffffff060,
               in_stack_fffffffffffff058,(int)((ulong)in_stack_fffffffffffff050 >> 0x20));
    std::__cxx11::string::~string(local_188);
    std::__cxx11::string::~string(local_1a8);
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
  }
  bVar1 = YAML::Node::IsMap((Node *)0x9da59b);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1e8,"Helper",&local_1e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_210,"adiosHostOptions",&local_211);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_238,"ParseHostOptionsFile",&local_239);
    std::operator+((char *)in_stack_fffffffffffff058,in_stack_fffffffffffff050);
    Throw<std::invalid_argument>
              (in_stack_fffffffffffff070,in_stack_fffffffffffff068,in_stack_fffffffffffff060,
               in_stack_fffffffffffff058,(int)((ulong)in_stack_fffffffffffff050 >> 0x20));
    std::__cxx11::string::~string(local_260);
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::~allocator((allocator<char> *)&local_239);
    std::__cxx11::string::~string(local_210);
    std::allocator<char>::~allocator((allocator<char> *)&local_211);
    std::__cxx11::string::~string(local_1e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  }
  YAML::Node::begin(in_stack_fffffffffffff088);
  while( true ) {
    YAML::Node::end(in_stack_fffffffffffff088);
    bVar1 = YAML::detail::iterator_base<YAML::detail::iterator_value_const>::operator!=
                      ((iterator_base<const_YAML::detail::iterator_value> *)
                       CONCAT17(in_stack_fffffffffffff017,in_stack_fffffffffffff010),
                       (iterator_base<const_YAML::detail::iterator_value> *)
                       in_stack_fffffffffffff008);
    YAML::detail::iterator_base<const_YAML::detail::iterator_value>::~iterator_base
              ((iterator_base<const_YAML::detail::iterator_value> *)0x9da823);
    if (!bVar1) break;
    YAML::detail::iterator_base<const_YAML::detail::iterator_value>::operator->
              (in_stack_fffffffffffff0e8);
    YAML::detail::iterator_base<const_YAML::detail::iterator_value>::proxy::operator->(&local_3a8);
    YAML::Node::as<std::__cxx11::string>(in_stack_fffffffffffff038);
    YAML::detail::iterator_base<const_YAML::detail::iterator_value>::proxy::~proxy
              ((proxy *)0x9da8e0);
    YAML::detail::iterator_base<const_YAML::detail::iterator_value>::operator->
              (in_stack_fffffffffffff0e8);
    YAML::detail::iterator_base<const_YAML::detail::iterator_value>::proxy::operator->(&local_4a8);
    YAML::Node::Node((Node *)CONCAT17(in_stack_fffffffffffff017,in_stack_fffffffffffff010),
                     in_stack_fffffffffffff008);
    YAML::detail::iterator_base<const_YAML::detail::iterator_value>::proxy::~proxy
              ((proxy *)0x9da936);
    bVar1 = YAML::Node::IsMap((Node *)0x9da943);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4c8,"Helper",&local_4c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4f0,"adiosHostOptions",&local_4f1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_518,"ParseHostOptionsFile",&local_519);
      std::operator+((char *)in_stack_fffffffffffff058,in_stack_fffffffffffff050);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff018._M_node,
                     (char *)CONCAT17(in_stack_fffffffffffff017,in_stack_fffffffffffff010));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff018._M_node,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff017,in_stack_fffffffffffff010));
      Throw<std::invalid_argument>
                (in_stack_fffffffffffff070,in_stack_fffffffffffff068,in_stack_fffffffffffff060,
                 in_stack_fffffffffffff058,(int)((ulong)in_stack_fffffffffffff050 >> 0x20));
      std::__cxx11::string::~string(local_540);
      std::__cxx11::string::~string(local_560);
      std::__cxx11::string::~string(local_580);
      std::__cxx11::string::~string(local_518);
      std::allocator<char>::~allocator((allocator<char> *)&local_519);
      std::__cxx11::string::~string(local_4f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
      std::__cxx11::string::~string(local_4c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
    }
    std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>::vector
              ((vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_> *)0x9dac9e);
    YAML::Node::begin(in_stack_fffffffffffff088);
    while( true ) {
      YAML::Node::end(in_stack_fffffffffffff088);
      bVar1 = YAML::detail::iterator_base<YAML::detail::iterator_value>::operator!=
                        ((iterator_base<YAML::detail::iterator_value> *)
                         CONCAT17(in_stack_fffffffffffff017,in_stack_fffffffffffff010),
                         (iterator_base<YAML::detail::iterator_value> *)in_stack_fffffffffffff008);
      YAML::detail::iterator_base<YAML::detail::iterator_value>::~iterator_base
                ((iterator_base<YAML::detail::iterator_value> *)0x9dacf9);
      if (!bVar1) break;
      HostConfig::HostConfig(in_stack_fffffffffffff080);
      YAML::detail::iterator_base<YAML::detail::iterator_value>::operator->
                ((iterator_base<YAML::detail::iterator_value> *)in_stack_fffffffffffff0e8);
      YAML::detail::iterator_base<YAML::detail::iterator_value>::proxy::operator->(&local_7b0);
      YAML::Node::as<std::__cxx11::string>(in_stack_fffffffffffff038);
      std::__cxx11::string::operator=(local_6d0,local_6f0);
      std::__cxx11::string::~string(local_6f0);
      YAML::detail::iterator_base<YAML::detail::iterator_value>::proxy::~proxy((proxy *)0x9dae08);
      YAML::detail::iterator_base<YAML::detail::iterator_value>::operator->
                ((iterator_base<YAML::detail::iterator_value> *)in_stack_fffffffffffff0e8);
      piVar2 = YAML::detail::iterator_base<YAML::detail::iterator_value>::proxy::operator->
                         (&local_878);
      YAML::detail::iterator_base<YAML::detail::iterator_value>::proxy::~proxy((proxy *)0x9dae57);
      local_7b8 = &(piVar2->super_pair<YAML::Node,_YAML::Node>).second;
      bVar1 = YAML::Node::IsMap((Node *)0x9dae74);
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_898,"Helper",&local_899);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_8c0,"adiosHostOptions",&local_8c1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_8e8,"ParseHostOptionsFile",&local_8e9);
        std::operator+((char *)in_stack_fffffffffffff058,in_stack_fffffffffffff050);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff018._M_node,
                       (char *)CONCAT17(in_stack_fffffffffffff017,in_stack_fffffffffffff010));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff018._M_node,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff017,in_stack_fffffffffffff010));
        Throw<std::invalid_argument>
                  (in_stack_fffffffffffff070,in_stack_fffffffffffff068,in_stack_fffffffffffff060,
                   in_stack_fffffffffffff058,(int)((ulong)in_stack_fffffffffffff050 >> 0x20));
        std::__cxx11::string::~string(local_910);
        std::__cxx11::string::~string(local_930);
        std::__cxx11::string::~string(local_950);
        std::__cxx11::string::~string(local_8e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_8e9);
        std::__cxx11::string::~string(local_8c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_8c1);
        std::__cxx11::string::~string(local_898);
        std::allocator<char>::~allocator((allocator<char> *)&local_899);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_970,"verbose",&local_971);
      anon_unknown_0::SetOption<int>
                ((int *)in_stack_fffffffffffff0a0,in_stack_fffffffffffff098,
                 in_stack_fffffffffffff090,(string *)in_stack_fffffffffffff088,
                 SUB81((ulong)in_stack_fffffffffffff080 >> 0x38,0));
      std::__cxx11::string::~string(local_970);
      std::allocator<char>::~allocator((allocator<char> *)&local_971);
      std::__cxx11::string::string(local_998);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_9b8,"protocol",&local_9b9);
      (anonymous_namespace)::SetOption<std::__cxx11::string>
                (in_stack_fffffffffffff0c0,
                 (string *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8),
                 in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8,
                 SUB81((ulong)in_stack_fffffffffffff0a0 >> 0x38,0));
      std::__cxx11::string::~string(local_9b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_9b9);
      std::__cxx11::string::string(local_9e0,local_998);
      local_6b0 = GetHostAccessProtocol(in_stack_fffffffffffff028);
      std::__cxx11::string::~string(local_9e0);
      if (local_6b0 == SSH) {
        std::__cxx11::string::string(local_a00);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a20,"authentication",&local_a21);
        (anonymous_namespace)::SetOption<std::__cxx11::string>
                  (in_stack_fffffffffffff0c0,
                   (string *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8),
                   in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8,
                   SUB81((ulong)in_stack_fffffffffffff0a0 >> 0x38,0));
        std::__cxx11::string::~string(local_a20);
        std::allocator<char>::~allocator((allocator<char> *)&local_a21);
        std::__cxx11::string::string(local_a48,local_a00);
        local_668._32_4_ = GetHostAuthProtocol(in_stack_fffffffffffff028);
        std::__cxx11::string::~string(local_a48);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a68,"host",&local_a69);
        (anonymous_namespace)::SetOption<std::__cxx11::string>
                  (in_stack_fffffffffffff0c0,
                   (string *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8),
                   in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8,
                   SUB81((ulong)in_stack_fffffffffffff0a0 >> 0x38,0));
        std::__cxx11::string::~string(local_a68);
        std::allocator<char>::~allocator((allocator<char> *)&local_a69);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a90,"user",&local_a91);
        (anonymous_namespace)::SetOption<std::__cxx11::string>
                  (in_stack_fffffffffffff0c0,
                   (string *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8),
                   in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8,
                   SUB81((ulong)in_stack_fffffffffffff0a0 >> 0x38,0));
        std::__cxx11::string::~string(local_a90);
        std::allocator<char>::~allocator((allocator<char> *)&local_a91);
        in_stack_fffffffffffff0e8 = (iterator_base<const_YAML::detail::iterator_value> *)local_668;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_ab8,"serverpath",&local_ab9);
        (anonymous_namespace)::SetOption<std::__cxx11::string>
                  (in_stack_fffffffffffff0c0,
                   (string *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8),
                   in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8,
                   SUB81((ulong)in_stack_fffffffffffff0a0 >> 0x38,0));
        std::__cxx11::string::~string(local_ab8);
        std::allocator<char>::~allocator((allocator<char> *)&local_ab9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_ae0,"port",&local_ae1);
        anon_unknown_0::SetOption<unsigned_short>
                  ((unsigned_short *)in_stack_fffffffffffff0a0,in_stack_fffffffffffff098,
                   in_stack_fffffffffffff090,(string *)in_stack_fffffffffffff088,
                   SUB81((ulong)in_stack_fffffffffffff080 >> 0x38,0));
        std::__cxx11::string::~string(local_ae0);
        std::allocator<char>::~allocator((allocator<char> *)&local_ae1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b08,"local_port",&local_b09);
        anon_unknown_0::SetOption<unsigned_short>
                  ((unsigned_short *)in_stack_fffffffffffff0a0,in_stack_fffffffffffff098,
                   in_stack_fffffffffffff090,(string *)in_stack_fffffffffffff088,
                   SUB81((ulong)in_stack_fffffffffffff080 >> 0x38,0));
        std::__cxx11::string::~string(local_b08);
        std::allocator<char>::~allocator((allocator<char> *)&local_b09);
        local_2c4 = 8;
        std::__cxx11::string::~string(local_a00);
      }
      else if (local_6b0 == XRootD) {
        std::__cxx11::string::string(local_b30);
        mandatory = (undefined1)((ulong)in_stack_fffffffffffff0a0 >> 0x38);
        in_stack_fffffffffffff0c0 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b51;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_b51 + 1),"authentication",(allocator *)in_stack_fffffffffffff0c0
                  );
        (anonymous_namespace)::SetOption<std::__cxx11::string>
                  (in_stack_fffffffffffff0c0,
                   (string *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8),
                   in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8,(bool)mandatory);
        std::__cxx11::string::~string((string *)(local_b51 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_b51);
        std::__cxx11::string::string(local_b78,local_b30);
        in_stack_fffffffffffff0bc = GetHostAuthProtocol(in_stack_fffffffffffff028);
        local_668._32_4_ = in_stack_fffffffffffff0bc;
        std::__cxx11::string::~string(local_b78);
        in_stack_fffffffffffff0a8 = &local_6a8;
        in_stack_fffffffffffff0b0 = (Node *)local_b99;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_b99 + 1),"host",(allocator *)in_stack_fffffffffffff0b0);
        (anonymous_namespace)::SetOption<std::__cxx11::string>
                  (in_stack_fffffffffffff0c0,
                   (string *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8),
                   in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8,(bool)mandatory);
        std::__cxx11::string::~string((string *)(local_b99 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_b99);
        in_stack_fffffffffffff098 = &local_688;
        in_stack_fffffffffffff0a0 = &local_bc1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_bc0,"user",in_stack_fffffffffffff0a0);
        (anonymous_namespace)::SetOption<std::__cxx11::string>
                  (in_stack_fffffffffffff0c0,
                   (string *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8),
                   in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8,
                   SUB81((ulong)in_stack_fffffffffffff0a0 >> 0x38,0));
        std::__cxx11::string::~string(local_bc0);
        std::allocator<char>::~allocator((allocator<char> *)&local_bc1);
        in_stack_fffffffffffff088 = (Node *)local_668;
        in_stack_fffffffffffff090 = (Node *)local_be9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_be9 + 1),"serverpath",(allocator *)in_stack_fffffffffffff090);
        (anonymous_namespace)::SetOption<std::__cxx11::string>
                  (in_stack_fffffffffffff0c0,
                   (string *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8),
                   in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8,
                   SUB81((ulong)in_stack_fffffffffffff0a0 >> 0x38,0));
        std::__cxx11::string::~string((string *)(local_be9 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_be9);
        in_stack_fffffffffffff080 = (HostConfig *)local_c11;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_c11 + 1),"port",(allocator *)in_stack_fffffffffffff080);
        anon_unknown_0::SetOption<unsigned_short>
                  ((unsigned_short *)in_stack_fffffffffffff0a0,in_stack_fffffffffffff098,
                   in_stack_fffffffffffff090,(string *)in_stack_fffffffffffff088,
                   SUB81((ulong)in_stack_fffffffffffff080 >> 0x38,0));
        std::__cxx11::string::~string((string *)(local_c11 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_c11);
        local_2c4 = 8;
        std::__cxx11::string::~string(local_b30);
      }
      else if (local_6b0 == S3) {
        in_stack_fffffffffffff068 = &local_620;
        in_stack_fffffffffffff070 = (string *)local_c39;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_c39 + 1),"profile",(allocator *)in_stack_fffffffffffff070);
        (anonymous_namespace)::SetOption<std::__cxx11::string>
                  (in_stack_fffffffffffff0c0,
                   (string *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8),
                   in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8,
                   SUB81((ulong)in_stack_fffffffffffff0a0 >> 0x38,0));
        std::__cxx11::string::~string((string *)(local_c39 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_c39);
        in_stack_fffffffffffff058 = (string *)(local_668 + 0x28);
        in_stack_fffffffffffff060 = (string *)local_c61;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_c61 + 1),"endpoint",(allocator *)in_stack_fffffffffffff060);
        (anonymous_namespace)::SetOption<std::__cxx11::string>
                  (in_stack_fffffffffffff0c0,
                   (string *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8),
                   in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8,
                   SUB81((ulong)in_stack_fffffffffffff0a0 >> 0x38,0));
        std::__cxx11::string::~string((string *)(local_c61 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_c61);
        in_stack_fffffffffffff050 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c89;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_c89 + 1),"aws_ec2_metadata",
                   (allocator *)in_stack_fffffffffffff050);
        anon_unknown_0::SetOption<bool>
                  ((bool *)in_stack_fffffffffffff0a0,in_stack_fffffffffffff098,
                   in_stack_fffffffffffff090,(string *)in_stack_fffffffffffff088,
                   SUB81((ulong)in_stack_fffffffffffff080 >> 0x38,0));
        std::__cxx11::string::~string((string *)(local_c89 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_c89);
        in_stack_fffffffffffff038 = &local_5ff;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_cb0,"recheck_metadata",&local_cb1);
        anon_unknown_0::SetOption<bool>
                  ((bool *)in_stack_fffffffffffff0a0,in_stack_fffffffffffff098,
                   in_stack_fffffffffffff090,(string *)in_stack_fffffffffffff088,
                   SUB81((ulong)in_stack_fffffffffffff080 >> 0x38,0));
        std::__cxx11::string::~string(local_cb0);
        std::allocator<char>::~allocator((allocator<char> *)&local_cb1);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_cd8,"Helper",&local_cd9);
        in_stack_fffffffffffff028 = (string *)local_d01;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_d01 + 1),"adiosHostOptions",
                   (allocator *)in_stack_fffffffffffff028);
        in_stack_fffffffffffff020 = &local_d29;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_d28,"ParseHostOptionsFile",in_stack_fffffffffffff020);
        std::operator+((char *)in_stack_fffffffffffff058,in_stack_fffffffffffff050);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff018._M_node,
                       (char *)CONCAT17(in_stack_fffffffffffff017,in_stack_fffffffffffff010));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff018._M_node,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff017,in_stack_fffffffffffff010));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff018._M_node,
                       (char *)CONCAT17(in_stack_fffffffffffff017,in_stack_fffffffffffff010));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff018._M_node,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff017,in_stack_fffffffffffff010));
        Throw<std::invalid_argument>
                  (in_stack_fffffffffffff070,in_stack_fffffffffffff068,in_stack_fffffffffffff060,
                   in_stack_fffffffffffff058,(int)((ulong)in_stack_fffffffffffff050 >> 0x20));
        std::__cxx11::string::~string(local_d50);
        std::__cxx11::string::~string(local_d70);
        std::__cxx11::string::~string(local_d90);
        std::__cxx11::string::~string(local_db0);
        std::__cxx11::string::~string(local_dd0);
        std::__cxx11::string::~string(local_d28);
        std::allocator<char>::~allocator((allocator<char> *)&local_d29);
        std::__cxx11::string::~string((string *)(local_d01 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_d01);
        std::__cxx11::string::~string(local_cd8);
        std::allocator<char>::~allocator((allocator<char> *)&local_cd9);
      }
      std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>::push_back
                ((vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_> *)
                 in_stack_fffffffffffff020,(value_type *)in_stack_fffffffffffff018._M_node);
      std::__cxx11::string::~string(local_998);
      HostConfig::~HostConfig
                ((HostConfig *)CONCAT17(in_stack_fffffffffffff017,in_stack_fffffffffffff010));
      YAML::detail::iterator_base<YAML::detail::iterator_value>::operator++
                ((iterator_base<YAML::detail::iterator_value> *)
                 CONCAT17(in_stack_fffffffffffff017,in_stack_fffffffffffff010));
    }
    local_2c4 = 5;
    YAML::detail::iterator_base<YAML::detail::iterator_value>::~iterator_base
              ((iterator_base<YAML::detail::iterator_value> *)0x9dad1c);
    pVar3 = std::
            map<std::__cxx11::string,std::vector<adios2::HostConfig,std::allocator<adios2::HostConfig>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<adios2::HostConfig,std::allocator<adios2::HostConfig>>>>>
            ::
            emplace<std::__cxx11::string&,std::vector<adios2::HostConfig,std::allocator<adios2::HostConfig>>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>_>_>
                        *)in_stack_fffffffffffff020,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff018._M_node,
                       (vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_> *)
                       CONCAT17(in_stack_fffffffffffff017,in_stack_fffffffffffff010));
    in_stack_fffffffffffff018 = pVar3.first._M_node;
    in_stack_fffffffffffff017 = pVar3.second;
    std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>::~vector
              ((vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_> *)
               in_stack_fffffffffffff020);
    YAML::Node::~Node((Node *)CONCAT17(in_stack_fffffffffffff017,in_stack_fffffffffffff010));
    std::__cxx11::string::~string(local_2e8);
    YAML::detail::iterator_base<const_YAML::detail::iterator_value>::operator++
              ((iterator_base<const_YAML::detail::iterator_value> *)
               CONCAT17(in_stack_fffffffffffff017,in_stack_fffffffffffff010));
  }
  local_2c4 = 2;
  YAML::detail::iterator_base<const_YAML::detail::iterator_value>::~iterator_base
            ((iterator_base<const_YAML::detail::iterator_value> *)0x9da846);
  YAML::Node::~Node((Node *)CONCAT17(in_stack_fffffffffffff017,in_stack_fffffffffffff010));
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void ParseHostOptionsFile(Comm &comm, const std::string &configFileYAML, HostOptions &hosts,
                          std::string &homePath)
{
    const std::string hint =
        "when parsing host config file " + configFileYAML + " in call to ADIOS constructor";

    const std::string configFileContents = comm.BroadcastFile(configFileYAML, hint);

    const YAML::Node document = YAML::Load(configFileContents);
    if (!document)
    {
        helper::Throw<std::invalid_argument>(
            "Helper", "adiosHostOptions", "ParseHostOptionsFile",
            "parser error in file " + configFileYAML +
                ": invalid format. Check with any YAML editor if format is ill-formed, " + hint);
    }

    if (!document.IsMap())
    {
        helper::Throw<std::invalid_argument>("Helper", "adiosHostOptions", "ParseHostOptionsFile",
                                             "parser error: not a YAML Map of hosts, " + hint);
    }

    /* top level is a dictionary of <hostname, dictionary of options> */
    for (auto itDoc = document.begin(); itDoc != document.end(); ++itDoc)
    {
        std::string hostname = itDoc->first.as<std::string>();

        /* a dictionary of host options, with each entry a dictionary */
        YAML::Node hostentry = itDoc->second;
        if (!hostentry.IsMap())
        {
            helper::Throw<std::invalid_argument>(
                "Helper", "adiosHostOptions", "ParseHostOptionsFile",
                "parser error for host " + hostname +
                    ": each host must have a YAML Map of options, " + hint);
        }

        std::vector<HostConfig> hostConfigs;
        for (auto itHost = hostentry.begin(); itHost != hostentry.end(); ++itHost)
        {
            /* one connection setup as a dictionary */
            HostConfig hc;
            hc.name = itHost->first.as<std::string>();
            const YAML::Node &hostmap = itHost->second;
            if (!hostmap.IsMap())
            {
                helper::Throw<std::invalid_argument>(
                    "Helper", "adiosHostOptions", "ParseHostOptionsFile",
                    "parser error for host " + hostname +
                        ": each entry in the list must be a YAML Map, " + hint);
            }

            SetOption(hc.verbose, "verbose", hostmap, hint);
            std::string protocolStr;
            SetOption(protocolStr, "protocol", hostmap, hint, isMandatory);
            hc.protocol = GetHostAccessProtocol(protocolStr);
            switch (hc.protocol)
            {
            case HostAccessProtocol::SSH: {
                std::string authStr;
                SetOption(authStr, "authentication", hostmap, hint, isMandatory);
                hc.authentication = GetHostAuthProtocol(authStr);
                SetOption(hc.hostname, "host", hostmap, hint, isMandatory);
                SetOption(hc.username, "user", hostmap, hint);
                SetOption(hc.remoteServerPath, "serverpath", hostmap, hint, isMandatory);
                SetOption(hc.port, "port", hostmap, hint);
                SetOption(hc.localPort, "local_port", hostmap, hint);
                break;
            }
            case HostAccessProtocol::XRootD: {
                std::string authStr;
                SetOption(authStr, "authentication", hostmap, hint, isMandatory);
                hc.authentication = GetHostAuthProtocol(authStr);
                SetOption(hc.hostname, "host", hostmap, hint, isMandatory);
                SetOption(hc.username, "user", hostmap, hint);
                SetOption(hc.remoteServerPath, "serverpath", hostmap, hint);
                SetOption(hc.port, "port", hostmap, hint);
                break;
            }
            case HostAccessProtocol::S3: {
                SetOption(hc.awsProfile, "profile", hostmap, hint);
                SetOption(hc.endpoint, "endpoint", hostmap, hint, isMandatory);
                SetOption(hc.isAWS_EC2, "aws_ec2_metadata", hostmap, hint);
                SetOption(hc.recheckMetadata, "recheck_metadata", hostmap, hint);
                break;
            }
            default:
                helper::Throw<std::invalid_argument>(
                    "Helper", "adiosHostOptions", "ParseHostOptionsFile",
                    "parser error: invalid access host protocol '" + protocolStr + " for " +
                        hc.name + "', " + hint);
            }

            hostConfigs.push_back(hc);
        }
        hosts.emplace(hostname, hostConfigs);
    }
}